

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_all_test(bool multi_kv)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  long extraout_RDX;
  code *__ptr;
  long lVar8;
  timeval *ptVar9;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar10;
  uint uVar11;
  uint uVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  undefined7 in_register_00000039;
  fdb_kvs_handle **ppfVar17;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  ulong uVar18;
  btree *doc;
  char cVar19;
  char *pcVar20;
  filemgr_ops *pfVar21;
  fdb_config *fconfig_01;
  fdb_kvs_handle **__s;
  char *pcVar22;
  fdb_kvs_handle *doc_00;
  fdb_kvs_handle *pfVar23;
  fdb_file_handle *dbfile;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *dbhandle;
  size_t bodylen;
  char kv_name [8];
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_38e8;
  fdb_kvs_handle *pfStack_38e0;
  fdb_file_handle *pfStack_38d8;
  fdb_iterator *pfStack_38d0;
  fdb_doc *pfStack_38c8;
  fdb_kvs_handle *pfStack_38c0;
  timeval tStack_38b8;
  fdb_kvs_config fStack_38a8;
  fdb_config fStack_3890;
  fdb_config *pfStack_3798;
  fdb_kvs_handle *pfStack_3790;
  fdb_kvs_handle *pfStack_3788;
  fdb_file_handle *pfStack_3780;
  fdb_kvs_handle *pfStack_3778;
  char acStack_376f [15];
  filemgr *pfStack_3760;
  docio_handle *pdStack_3758;
  btreeblk_handle *pbStack_3750;
  size_t sStack_3748;
  filemgr *pfStack_3740;
  docio_handle *pdStack_3738;
  btreeblk_handle *pbStack_3730;
  timeval tStack_3728;
  undefined1 auStack_3718 [76];
  uint uStack_36cc;
  char *pcStack_35d8;
  atomic<unsigned_long> aStack_35d0;
  btree *pbStack_35c8;
  fdb_kvs_handle *pfStack_35c0;
  fdb_kvs_handle *pfStack_35b8;
  code *pcStack_35b0;
  uint uStack_359c;
  fdb_txn *pfStack_3598;
  fdb_kvs_handle *pfStack_3590;
  fdb_iterator *pfStack_3588;
  fdb_snapshot_info_t *pfStack_3580;
  int iStack_3574;
  fdb_kvs_handle *pfStack_3570;
  fdb_kvs_handle *apfStack_3568 [3];
  uint64_t uStack_3550;
  fdb_kvs_config fStack_3548;
  char acStack_3530 [8];
  timeval tStack_3528;
  char acStack_3518 [256];
  btree bStack_3418;
  char acStack_33c8 [256];
  char acStack_32c8 [256];
  fdb_config fStack_31c8;
  fdb_kvs_handle **ppfStack_30d0;
  fdb_kvs_handle **ppfStack_30c8;
  fdb_kvs_handle *pfStack_30c0;
  fdb_kvs_handle **ppfStack_30b8;
  fdb_kvs_handle *pfStack_30b0;
  code *pcStack_30a8;
  fdb_kvs_handle **ppfStack_30a0;
  fdb_kvs_handle *pfStack_3098;
  fdb_kvs_handle *apfStack_3090 [9];
  fdb_kvs_config fStack_3048;
  timeval tStack_3030;
  fdb_kvs_handle *apfStack_3020 [33];
  fdb_config fStack_2f18;
  fdb_kvs_handle *apfStack_2e20 [32];
  fdb_kvs_handle *apfStack_2d20 [32];
  fdb_kvs_handle afStack_2c20 [15];
  fdb_config *pfStack_c18;
  fdb_kvs_handle *pfStack_c10;
  fdb_kvs_handle *pfStack_c08;
  fdb_config *pfStack_c00;
  fdb_kvs_handle *pfStack_bf8;
  fdb_kvs_handle *pfStack_bf0;
  fdb_kvs_handle *pfStack_be0;
  fdb_file_handle *pfStack_bd8;
  fdb_iterator *pfStack_bd0;
  fdb_doc *pfStack_bc8;
  fdb_kvs_handle *pfStack_bc0;
  undefined1 auStack_bb7 [31];
  undefined1 auStack_b98 [72];
  fdb_config fStack_b50;
  timeval *ptStack_a58;
  fdb_kvs_handle *pfStack_a50;
  fdb_kvs_handle *pfStack_a48;
  fdb_config *pfStack_a40;
  fdb_kvs_handle *pfStack_a38;
  int iStack_a24;
  fdb_kvs_handle *pfStack_a20;
  fdb_file_handle *pfStack_a18;
  pthread_t pStack_a10;
  undefined1 auStack_a07 [63];
  undefined1 auStack_9c8 [16];
  uint64_t uStack_9b8;
  fdb_config fStack_8d0;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_handle *pfStack_7c8;
  filemgr_ops *pfStack_7c0;
  fdb_kvs_handle *pfStack_7b8;
  fdb_kvs_handle *pfStack_7b0;
  timeval tStack_7a0;
  fdb_kvs_handle *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  fdb_kvs_handle *pfStack_778;
  fdb_kvs_handle *pfStack_770;
  fdb_kvs_handle *pfStack_768;
  fdb_file_handle *pfStack_760;
  undefined1 auStack_754 [12];
  kvs_ops_stat *pkStack_748;
  atomic<unsigned_long> aStack_740;
  timeval tStack_710;
  __atomic_base<unsigned_long> _Stack_700;
  kvs_ops_stat *pkStack_6f8;
  __atomic_base<unsigned_long> _Stack_6f0;
  fdb_kvs_info fStack_6e0;
  undefined1 uStack_690;
  undefined1 uStack_682;
  btree *pbStack_678;
  code *pcStack_658;
  uint8_t auStack_650 [8];
  filemgr_ops *pfStack_648;
  fdb_kvs_handle *pfStack_5b8;
  fdb_kvs_handle *pfStack_5b0;
  fdb_kvs_handle *pfStack_5a8;
  fdb_txn *pfStack_5a0;
  fdb_kvs_handle *pfStack_598;
  fdb_kvs_handle *pfStack_590;
  fdb_file_handle *local_580;
  uint local_574;
  fdb_kvs_handle *local_570;
  fdb_kvs_handle *local_568;
  undefined1 local_560 [48];
  atomic<unsigned_long> local_530;
  undefined1 local_528 [32];
  fdb_kvs_info local_508;
  timeval local_4d8;
  undefined1 local_4c8 [160];
  char local_428 [256];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pfStack_590 = (fdb_kvs_handle *)0x11ae87;
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  pfStack_590 = (fdb_kvs_handle *)0x11ae8c;
  memleak_start();
  pfStack_590 = (fdb_kvs_handle *)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_590 = (fdb_kvs_handle *)0x11aea8;
  fdb_get_default_config();
  pfStack_590 = (fdb_kvs_handle *)0x11aeb2;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0;
  pfStack_590 = (fdb_kvs_handle *)0x11aee8;
  local_128.multi_kv_instances = multi_kv;
  fdb_open(&local_580,"./mvcc_test6",&local_128);
  local_574 = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_574 == 0) {
    pfStack_590 = (fdb_kvs_handle *)0x11af54;
    fdb_kvs_open_default
              (local_580,(fdb_kvs_handle **)(local_560 + 8),(fdb_kvs_config *)(local_528 + 8));
    pfVar13 = (fdb_kvs_handle *)0x1;
  }
  else {
    ppfVar10 = (fdb_kvs_handle **)(local_560 + 8);
    unaff_R12 = (fdb_kvs_handle *)(local_528 + 8);
    uVar18 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11af19;
      sprintf(local_528,"kv%d",uVar18 & 0xffffffff);
      pfStack_590 = (fdb_kvs_handle *)0x11af2c;
      fdb_kvs_open(local_580,ppfVar10,local_528,(fdb_kvs_config *)unaff_R12);
      uVar18 = uVar18 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar18 != 4);
    pfVar13 = (fdb_kvs_handle *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  pcVar20 = (char *)0x0;
  __ptr = logCallbackFunc;
  pcVar22 = "rollback_all_test";
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11af7a;
    fVar2 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(local_560 + (long)pcVar20 * 8 + 8),logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_590 = (fdb_kvs_handle *)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar20 = (char *)((long)&((fdb_txn *)pcVar20)->handle + 1);
  } while (pfVar13 != (fdb_kvs_handle *)pcVar20);
  uVar18 = 0;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11afa9;
    sprintf(local_328,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11afc5;
    sprintf(local_428,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11afe1;
    sprintf(local_228,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11aff4;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11afff;
    sVar6 = strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b00a;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x11b02f;
    fdb_doc_create((fdb_doc **)(local_4c8 + uVar18 * 8),local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b03f;
      fdb_set(*(fdb_kvs_handle **)(local_560 + lVar8 * 8 + 8),*(fdb_doc **)(local_4c8 + uVar18 * 8))
      ;
      lVar8 = lVar8 + 1;
    } while (pfVar13 != (fdb_kvs_handle *)lVar8);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  pfStack_590 = (fdb_kvs_handle *)0x11b063;
  fdb_commit(local_580,'\x01');
  uVar18 = 5;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b085;
    sprintf(local_328,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b0a1;
    sprintf(local_428,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b0bd;
    sprintf(local_228,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b0d0;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b0db;
    sVar6 = strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b0e6;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x11b10b;
    fdb_doc_create((fdb_doc **)(local_4c8 + uVar18 * 8),local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b11c;
      fdb_set(*(fdb_kvs_handle **)(local_560 + lVar8 * 8 + 8),*(fdb_doc **)(local_4c8 + uVar18 * 8))
      ;
      lVar8 = lVar8 + 1;
    } while (pfVar13 != (fdb_kvs_handle *)lVar8);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 10);
  pfStack_590 = (fdb_kvs_handle *)0x11b13d;
  fdb_commit(local_580,'\0');
  uVar18 = 10;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b15f;
    sprintf(local_328,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b17b;
    sprintf(local_428,"meta%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b197;
    sprintf(local_228,"body%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b1aa;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b1b5;
    sVar6 = strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b1c0;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x11b1e5;
    fdb_doc_create((fdb_doc **)(local_4c8 + uVar18 * 8),local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b1f6;
      fdb_set(*(fdb_kvs_handle **)(local_560 + lVar8 * 8 + 8),*(fdb_doc **)(local_4c8 + uVar18 * 8))
      ;
      lVar8 = lVar8 + 1;
    } while (pfVar13 != (fdb_kvs_handle *)lVar8);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0xf);
  pfStack_590 = (fdb_kvs_handle *)0x11b21a;
  fdb_commit(local_580,'\x01');
  uVar18 = 0xf;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b23c;
    sprintf(local_328,"key%d",uVar18 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b258;
    sprintf(local_428,"meta%d",uVar18 & 0xffffffff);
    pfVar23 = (fdb_kvs_handle *)local_228;
    pfStack_590 = (fdb_kvs_handle *)0x11b274;
    sprintf((char *)pfVar23,"body%d",uVar18 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(local_4c8 + uVar18 * 8);
    pfStack_590 = (fdb_kvs_handle *)0x11b287;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b292;
    unaff_R13 = (fdb_kvs_handle *)strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b29d;
    sVar6 = strlen((char *)pfVar23);
    pfStack_590 = (fdb_kvs_handle *)0x11b2c2;
    fdb_doc_create((fdb_doc **)unaff_R12,local_328,sVar5,local_428,(size_t)unaff_R13,pfVar23,sVar6);
    pcVar20 = (char *)0x0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b2d3;
      fdb_set(*(fdb_kvs_handle **)(local_560 + (long)pcVar20 * 8 + 8),
              *(fdb_doc **)&unaff_R12->kvs_config);
      pcVar20 = (char *)((long)pcVar20 + 1);
    } while (pfVar13 != (fdb_kvs_handle *)pcVar20);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 0x14);
  pfStack_590 = (fdb_kvs_handle *)0x11b2f4;
  fdb_commit(local_580,'\0');
  pfStack_590 = (fdb_kvs_handle *)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (local_580,(fdb_snapshot_info_t **)&local_568,(uint64_t *)&local_570);
  pcVar22 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b698;
  pcVar20 = (char *)(ulong)local_574;
  cVar19 = (char)local_574;
  if (cVar19 == '\0') {
    if (local_570 != (fdb_kvs_handle *)0x4) {
      pfStack_590 = (fdb_kvs_handle *)0x11b341;
      rollback_all_test();
    }
  }
  else if (local_570 != (fdb_kvs_handle *)0x8) {
    pfStack_590 = (fdb_kvs_handle *)0x11b32f;
    rollback_all_test();
  }
  pfStack_590 = (fdb_kvs_handle *)0x11b354;
  fVar2 = fdb_rollback_all(local_580,(fdb_snapshot_marker_t)local_568->kvs);
  if (cVar19 == '\0') {
LAB_0011b41a:
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
    unaff_R13 = (fdb_kvs_handle *)(local_560 + 8);
    if (cVar19 != '\0') {
      pcVar22 = local_528;
      pcVar20 = "rollback_all_test";
      pfVar23 = (fdb_kvs_handle *)0x0;
      unaff_R12 = pfVar13;
      do {
        pfStack_590 = (fdb_kvs_handle *)0x11b450;
        sprintf(pcVar22,"kv%d",pfVar23);
        pfStack_590 = (fdb_kvs_handle *)0x11b465;
        fVar2 = fdb_kvs_open(local_580,(fdb_kvs_handle **)unaff_R13,pcVar22,
                             (fdb_kvs_config *)(local_528 + 8));
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
        pfStack_590 = (fdb_kvs_handle *)0x11b480;
        fVar2 = fdb_set_log_callback
                          (*(fdb_kvs_handle **)&unaff_R13->kvs_config,logCallbackFunc,
                           "rollback_all_test");
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
        pfVar23 = (fdb_kvs_handle *)(ulong)((int)pfVar23 + 1);
        unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
        unaff_R12 = (fdb_kvs_handle *)((long)&unaff_R12[-1].bub_ctx.handle + 7);
      } while (unaff_R12 != (fdb_kvs_handle *)0x0);
    }
    unaff_R12 = (fdb_kvs_handle *)0x0;
    unaff_R13 = (fdb_kvs_handle *)local_560;
    pcVar22 = (char *)&local_530;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b4b2;
      fVar2 = fdb_get_kvs_info(*(fdb_kvs_handle **)(local_560 + (long)unaff_R12 * 8 + 8),&local_508)
      ;
      __ptr = (code *)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
      if ((hbtrie *)local_508.last_seqnum != (hbtrie *)0xf) {
        pfStack_590 = (fdb_kvs_handle *)0x11b566;
        rollback_all_test();
      }
      if ((filemgr_ops *)local_508.doc_count != (filemgr_ops *)0xf) {
        pfStack_590 = (fdb_kvs_handle *)0x11b578;
        rollback_all_test();
      }
      pfStack_590 = (fdb_kvs_handle *)0x11b4ea;
      fVar2 = fdb_get(*(fdb_kvs_handle **)(local_560 + (long)unaff_R12 * 8 + 8),
                      (fdb_doc *)local_4c8._152_8_);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
      pfStack_590 = (fdb_kvs_handle *)0x11b512;
      fVar2 = fdb_get_kv(*(fdb_kvs_handle **)(local_560 + (long)unaff_R12 * 8 + 8),
                         *(_func_cs_off_t_int **)(local_4c8._0_8_ + 0x20),
                         (size_t)*(_func_int_char_ptr_int_mode_t **)local_4c8._0_8_,
                         (void **)unaff_R13,(size_t *)pcVar22);
      __ptr = (code *)local_560._0_8_;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
      pcVar20 = *(char **)(local_4c8._0_8_ + 0x40);
      pfStack_590 = (fdb_kvs_handle *)0x11b53b;
      iVar3 = bcmp(pcVar20,(void *)local_560._0_8_,
                   (size_t)local_530.super___atomic_base<unsigned_long>._M_i);
      if (iVar3 != 0) goto LAB_0011b67c;
      pfStack_590 = (fdb_kvs_handle *)0x11b54b;
      free(__ptr);
      uVar12 = local_574;
      unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
      pfVar23 = (fdb_kvs_handle *)__ptr;
    } while (pfVar13 != unaff_R12);
    pfVar23 = (fdb_kvs_handle *)0x0;
    pcVar20 = (char *)(ulong)local_574;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b596;
      fVar2 = fdb_set(*(fdb_kvs_handle **)(local_560 + (long)pfVar23 * 8 + 8),
                      (fdb_doc *)local_4c8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
      pfVar23 = (fdb_kvs_handle *)&(pfVar23->kvs_config).field_0x1;
    } while (pfVar13 != pfVar23);
    pfStack_590 = (fdb_kvs_handle *)0x11b5b5;
    fVar2 = fdb_commit(local_580,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
    pfStack_590 = (fdb_kvs_handle *)0x11b5c7;
    fdb_close(local_580);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b5d6;
      fdb_doc_free(*(fdb_doc **)(local_4c8 + lVar8 * 8));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x14);
    pfStack_590 = (fdb_kvs_handle *)0x11b5ee;
    fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)local_568,(uint64_t)local_570);
    pfVar23 = (fdb_kvs_handle *)0x14;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_590 = (fdb_kvs_handle *)0x11b5fb;
      fdb_shutdown();
      pfStack_590 = (fdb_kvs_handle *)0x11b600;
      memleak_end();
      pcVar22 = "single kv mode:";
      if ((char)uVar12 != '\0') {
        pcVar22 = "multiple kv mode:";
      }
      pfStack_590 = (fdb_kvs_handle *)0x11b62e;
      sprintf(local_228,"rollback all test %s",pcVar22);
      pcVar22 = "%s PASSED\n";
      if (rollback_all_test(bool)::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_590 = (fdb_kvs_handle *)0x11b65b;
      fprintf(_stderr,pcVar22,local_228);
      return;
    }
    goto LAB_0011b6a7;
  }
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
  pfVar23 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b372;
    fdb_kvs_close(*(fdb_kvs_handle **)(local_560 + (long)pfVar23 * 8 + 8));
    pfVar23 = (fdb_kvs_handle *)((long)pfVar23 + 1);
  } while (pfVar13 != pfVar23);
  pfStack_590 = (fdb_kvs_handle *)0x11b396;
  fVar2 = fdb_open((fdb_file_handle **)&local_508,"./mvcc_test6",&local_128);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
  pfStack_590 = (fdb_kvs_handle *)0x11b3bc;
  fVar2 = fdb_kvs_open((fdb_file_handle *)local_508.name,(fdb_kvs_handle **)local_560,"kv0",
                       (fdb_kvs_config *)(local_528 + 8));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
  pfStack_590 = (fdb_kvs_handle *)0x11b3d7;
  fVar2 = fdb_rollback_all(local_580,(fdb_snapshot_marker_t)local_568->kvs);
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
  pfStack_590 = (fdb_kvs_handle *)0x11b3ea;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)local_560._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
  pfStack_590 = (fdb_kvs_handle *)0x11b3ff;
  fVar2 = fdb_close((fdb_file_handle *)local_508.name);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_590 = (fdb_kvs_handle *)0x11b41a;
    fVar2 = fdb_rollback_all(local_580,(fdb_snapshot_marker_t)local_568->kvs);
    goto LAB_0011b41a;
  }
  goto LAB_0011b6c5;
LAB_0011be65:
  pfStack_a38 = (fdb_kvs_handle *)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  pfStack_a38 = (fdb_kvs_handle *)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  pfStack_bf0 = (fdb_kvs_handle *)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_30a8 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_30a8 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_30a8 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_30a8 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_30a8 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_30a8 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_30a8 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_35b0 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_3788 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_3788 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011b672:
  pfStack_590 = (fdb_kvs_handle *)0x11b677;
  rollback_all_test();
LAB_0011b677:
  pfStack_590 = (fdb_kvs_handle *)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  pfStack_590 = (fdb_kvs_handle *)0x11b684;
  rollback_all_test();
  pfVar23 = (fdb_kvs_handle *)__ptr;
LAB_0011b684:
  pfStack_590 = (fdb_kvs_handle *)0x11b689;
  rollback_all_test();
LAB_0011b689:
  pfStack_590 = (fdb_kvs_handle *)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  pfStack_590 = (fdb_kvs_handle *)0x11b693;
  rollback_all_test();
LAB_0011b693:
  pfStack_590 = (fdb_kvs_handle *)0x11b698;
  rollback_all_test();
LAB_0011b698:
  pfStack_590 = (fdb_kvs_handle *)0x11b69d;
  rollback_all_test();
LAB_0011b69d:
  pfStack_590 = (fdb_kvs_handle *)0x11b6a2;
  rollback_all_test();
LAB_0011b6a2:
  pfStack_590 = (fdb_kvs_handle *)0x11b6a7;
  rollback_all_test();
LAB_0011b6a7:
  pfStack_590 = (fdb_kvs_handle *)0x11b6ac;
  rollback_all_test();
LAB_0011b6ac:
  pfStack_590 = (fdb_kvs_handle *)0x11b6b1;
  rollback_all_test();
LAB_0011b6b1:
  pfStack_590 = (fdb_kvs_handle *)0x11b6b6;
  rollback_all_test();
LAB_0011b6b6:
  pfStack_590 = (fdb_kvs_handle *)0x11b6bb;
  rollback_all_test();
LAB_0011b6bb:
  pfStack_590 = (fdb_kvs_handle *)0x11b6c0;
  rollback_all_test();
LAB_0011b6c0:
  pfStack_590 = (fdb_kvs_handle *)0x11b6c5;
  rollback_all_test();
LAB_0011b6c5:
  pfStack_590 = (fdb_kvs_handle *)auto_compaction_snapshots_test;
  rollback_all_test();
  pfStack_788 = (fdb_kvs_handle *)0x11b6e7;
  pfStack_5b8 = pfVar23;
  pfStack_5b0 = unaff_R12;
  pfStack_5a8 = unaff_R13;
  pfStack_5a0 = (fdb_txn *)pcVar20;
  pfStack_598 = (fdb_kvs_handle *)pcVar22;
  pfStack_590 = pfVar13;
  gettimeofday(&tStack_710,(__timezone_ptr_t)0x0);
  pfStack_788 = (fdb_kvs_handle *)0x11b6ec;
  memleak_start();
  pfVar21 = (filemgr_ops *)auStack_754;
  auStack_754._0_4_ = 0;
  pfStack_788 = (fdb_kvs_handle *)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar23 = (fdb_kvs_handle *)&stack0xfffffffffffff950;
  pfStack_788 = (fdb_kvs_handle *)0x11b714;
  fdb_get_default_config();
  uStack_682 = 1;
  uStack_690 = 1;
  pcStack_658 = compaction_cb_count;
  auStack_650[0] = ' ';
  auStack_650[1] = '\0';
  auStack_650[2] = '\0';
  auStack_650[3] = '\0';
  pbStack_678 = (btree *)0x1;
  pfVar16 = (fdb_kvs_handle *)0x156054;
  pfStack_788 = (fdb_kvs_handle *)0x11b74e;
  pfStack_648 = pfVar21;
  fVar2 = fdb_open(&pfStack_760,"mvcc_test1",(fdb_config *)pfVar23);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar23 = (fdb_kvs_handle *)(auStack_754 + 4);
    pfStack_788 = (fdb_kvs_handle *)0x11b763;
    fdb_get_default_kvs_config();
    _Stack_6f0 = aStack_740.super___atomic_base<unsigned_long>._M_i;
    _Stack_700._M_i = auStack_754._4_8_;
    pkStack_6f8 = pkStack_748;
    pfVar16 = (fdb_kvs_handle *)&pfStack_768;
    pfStack_788 = (fdb_kvs_handle *)0x11b788;
    fVar2 = fdb_kvs_open_default
                      (pfStack_760,(fdb_kvs_handle **)pfVar16,(fdb_kvs_config *)&_Stack_700);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    unaff_R13 = (fdb_kvs_handle *)0x156958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      pcVar22 = (char *)0xcccccccd;
      pfVar14 = (fdb_kvs_handle *)0x1565bd;
      pfVar16 = (fdb_kvs_handle *)(auStack_754 + 4);
      iVar3 = (int)unaff_R12;
      pfStack_788 = (fdb_kvs_handle *)0x11b7bc;
      sprintf((char *)pfVar16,"%d",unaff_R12);
      pfVar13 = pfStack_768;
      pfStack_788 = (fdb_kvs_handle *)0x11b7c9;
      sVar5 = strlen((char *)pfVar16);
      pfStack_788 = (fdb_kvs_handle *)0x11b7e0;
      fVar2 = fdb_set_kv(pfVar13,pfVar16,sVar5,"value",5);
      pfVar15 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_788 = (fdb_kvs_handle *)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        pfStack_788 = (fdb_kvs_handle *)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        pfVar23 = pfVar13;
        pfStack_788 = (fdb_kvs_handle *)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        pfStack_788 = (fdb_kvs_handle *)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        pfStack_788 = (fdb_kvs_handle *)0x11ba3c;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar15;
        doc_00 = (fdb_kvs_handle *)pcVar22;
LAB_0011ba3c:
        pfVar15 = unaff_R13;
        unaff_R13 = pfVar14;
        pfStack_788 = (fdb_kvs_handle *)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        pfStack_788 = (fdb_kvs_handle *)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        pfStack_788 = (fdb_kvs_handle *)0x11ba5b;
        pfVar16 = pfVar23;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        pfStack_788 = (fdb_kvs_handle *)0x11ba60;
        auto_compaction_snapshots_test();
        pfVar13 = unaff_R13;
        pcVar22 = (char *)doc_00;
LAB_0011ba60:
        unaff_R13 = pfVar15;
        pfStack_788 = (fdb_kvs_handle *)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        pfVar21 = (filemgr_ops *)(auStack_754 + 4);
        pfStack_788 = (fdb_kvs_handle *)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      pfVar13 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar3) {
        pfVar16 = (fdb_kvs_handle *)0x0;
        pfStack_788 = (fdb_kvs_handle *)0x11b80c;
        fVar2 = fdb_commit(pfStack_760,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      pfVar23 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar3) {
        pfStack_788 = (fdb_kvs_handle *)0x11b83d;
        fVar2 = fdb_get_kvs_info(pfStack_768,&fStack_6e0);
        pfVar23 = (fdb_kvs_handle *)fStack_6e0.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        pfStack_788 = (fdb_kvs_handle *)0x11b85f;
        fVar2 = fdb_snapshot_open(pfStack_768,&pfStack_770,fStack_6e0.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        pfStack_788 = (fdb_kvs_handle *)0x11b885;
        fdb_doc_create((fdb_doc **)&pfStack_778,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_778->fhandle = (fdb_file_handle *)pfVar23;
        pfStack_788 = (fdb_kvs_handle *)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_770,(fdb_doc *)pfStack_778);
        pfVar15 = pfStack_778;
        doc_00 = (fdb_kvs_handle *)pcVar22;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar22 = (char *)pfStack_778->op_stats;
        pfStack_788 = (fdb_kvs_handle *)0x11b8b9;
        sVar5 = strlen(auStack_754 + 4);
        pfStack_788 = (fdb_kvs_handle *)0x11b8c7;
        iVar4 = bcmp(pcVar22,auStack_754 + 4,sVar5);
        doc_00 = (fdb_kvs_handle *)pcVar22;
        if (iVar4 != 0) goto LAB_0011ba41;
        pfStack_788 = (fdb_kvs_handle *)0x11b8d7;
        fdb_doc_free((fdb_doc *)pfVar15);
        pfStack_788 = (fdb_kvs_handle *)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_770);
        pfVar14 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        pfVar16 = (fdb_kvs_handle *)&pfStack_770;
        pfStack_788 = (fdb_kvs_handle *)0x11b8ff;
        fVar2 = fdb_snapshot_open(pfStack_768,(fdb_kvs_handle **)pfVar16,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        pfStack_788 = (fdb_kvs_handle *)0x11b925;
        fdb_doc_create((fdb_doc **)&pfStack_778,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_778->fhandle = (fdb_file_handle *)pfVar23;
        pfStack_788 = (fdb_kvs_handle *)0x11b938;
        pfVar16 = pfStack_778;
        fVar2 = fdb_get_byseq(pfStack_770,(fdb_doc *)pfStack_778);
        doc_00 = pfStack_778;
        pfVar13 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        pfVar23 = (fdb_kvs_handle *)pfStack_778->op_stats;
        pfVar16 = (fdb_kvs_handle *)(auStack_754 + 4);
        pfStack_788 = (fdb_kvs_handle *)0x11b956;
        sVar5 = strlen((char *)pfVar16);
        pfStack_788 = (fdb_kvs_handle *)0x11b964;
        iVar4 = bcmp(pfVar23,pfVar16,sVar5);
        if (iVar4 != 0) goto LAB_0011ba4e;
        pfStack_788 = (fdb_kvs_handle *)0x11b974;
        fdb_doc_free((fdb_doc *)doc_00);
        pfStack_788 = (fdb_kvs_handle *)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_770);
        pcVar22 = (char *)0xcccccccd;
        pfVar13 = (fdb_kvs_handle *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      pfVar21 = (filemgr_ops *)(auStack_754 + 4);
      pcVar22 = (char *)0xcccccccd;
      pfVar13 = (fdb_kvs_handle *)0x1565bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 100000);
    pfStack_788 = (fdb_kvs_handle *)0x11b9b0;
    fVar2 = fdb_close(pfStack_760);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    pfStack_788 = (fdb_kvs_handle *)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_788 = (fdb_kvs_handle *)0x11b9ca;
      memleak_end();
      pfStack_788 = (fdb_kvs_handle *)0x11b9e4;
      sprintf(auStack_754 + 4,"auto compaction completed %d times with snapshots",
              (ulong)(uint)auStack_754._0_4_);
      pcVar22 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_788 = (fdb_kvs_handle *)0x11ba11;
      fprintf(_stderr,pcVar22,auStack_754 + 4);
      return;
    }
  }
  else {
LAB_0011ba6a:
    pfStack_788 = (fdb_kvs_handle *)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    pfStack_788 = (fdb_kvs_handle *)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    pfStack_788 = (fdb_kvs_handle *)0x11ba79;
    auto_compaction_snapshots_test();
  }
  pfStack_788 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar15 = (fdb_kvs_handle *)((ulong)pfVar16 & 0xffffffff);
  __tv = &tStack_7a0;
  pfStack_7b0 = (fdb_kvs_handle *)0x11ba95;
  pfStack_790 = pfVar23;
  pfStack_788 = pfVar13;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar16 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&pfStack_778->kvs_config = *(int *)&pfStack_778->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_7b0 = (fdb_kvs_handle *)0x11bab4;
    compaction_cb_count();
  }
  pfStack_7b0 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_a38 = (fdb_kvs_handle *)0x11bad9;
  pfStack_7d0 = unaff_R12;
  pfStack_7c8 = unaff_R13;
  pfStack_7c0 = pfVar21;
  pfStack_7b8 = (fdb_kvs_handle *)pcVar22;
  pfStack_7b0 = pfVar15;
  gettimeofday((timeval *)(auStack_a07 + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_a38 = (fdb_kvs_handle *)0x11bade;
  memleak_start();
  iStack_a24 = 10000;
  if (__tv == (timeval *)0x0) {
    pfStack_a38 = (fdb_kvs_handle *)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    pfStack_a38 = (fdb_kvs_handle *)0x11bb08;
    fdb_get_default_config();
    fconfig_01 = &fStack_8d0;
    pfStack_a38 = (fdb_kvs_handle *)0x11bb20;
    memcpy(fconfig_01,auStack_9c8,0xf8);
    fStack_8d0.block_reusing_threshold = 0;
    pfStack_a38 = (fdb_kvs_handle *)0x11bb3f;
    fVar2 = fdb_open(&pfStack_a18,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_a38 = (fdb_kvs_handle *)0x11bb54;
      fdb_get_default_kvs_config();
      auStack_a07._39_8_ = uStack_9b8;
      auStack_a07._23_8_ = auStack_9c8._0_8_;
      auStack_a07._31_8_ = auStack_9c8._8_8_;
      pfStack_a38 = (fdb_kvs_handle *)0x11bb76;
      fVar2 = fdb_kvs_open_default(pfStack_a18,&pfStack_a20,(fdb_kvs_config *)(auStack_a07 + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_a24) {
        unaff_R13 = (fdb_kvs_handle *)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_9c8 >> 8),1);
        uVar12 = 0;
        do {
          uVar11 = uVar12 + 1;
          pfVar15 = (fdb_kvs_handle *)(ulong)uVar11;
          pfStack_a38 = (fdb_kvs_handle *)0x11bbb0;
          sprintf(auStack_a07,"%d",pfVar15);
          unaff_R12 = pfStack_a20;
          pfStack_a38 = (fdb_kvs_handle *)0x11bbbd;
          sVar5 = strlen(auStack_a07);
          pfStack_a38 = (fdb_kvs_handle *)0x11bbd8;
          fVar2 = fdb_set_kv(unaff_R12,auStack_a07,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            pfStack_a38 = (fdb_kvs_handle *)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar9 = __tv;
          if ((int)((ulong)unaff_R13 / 10) * 10 - 1U == uVar12) {
            ptVar9 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            pfStack_a38 = (fdb_kvs_handle *)0x11bc18;
            fdb_commit(pfStack_a18,~(byte)__tv & 1);
          }
          unaff_R13 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 1);
          __tv = ptVar9;
          uVar12 = uVar11;
        } while ((int)uVar11 < iStack_a24);
      }
      pfVar15 = (fdb_kvs_handle *)0x1;
      pfStack_a38 = (fdb_kvs_handle *)0x11bc3f;
      fdb_commit(pfStack_a18,'\x01');
      pfStack_a38 = (fdb_kvs_handle *)0x11bc4e;
      fdb_get_kvs_info(pfStack_a20,(fdb_kvs_info *)auStack_9c8);
      __tv = (timeval *)(auStack_9c8 + 8);
      if ((fdb_config *)auStack_9c8._8_8_ != (fdb_config *)(long)iStack_a24) {
        pfStack_a38 = (fdb_kvs_handle *)0x11bc6a;
        rollback_during_ops_test();
      }
      pfStack_a38 = (fdb_kvs_handle *)0x11bc82;
      pthread_create(&pStack_a10,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_a24);
      fconfig_01 = (fdb_config *)0x156958;
      pcVar22 = auStack_a07;
      unaff_R12 = (fdb_kvs_handle *)0x1565bd;
      do {
        pfStack_a38 = (fdb_kvs_handle *)0x11bca4;
        sprintf(pcVar22,"%d",pfVar15);
        unaff_R13 = pfStack_a20;
        pfStack_a38 = (fdb_kvs_handle *)0x11bcb1;
        sVar5 = strlen(pcVar22);
        pfStack_a38 = (fdb_kvs_handle *)0x11bcc8;
        fVar2 = fdb_set_kv(unaff_R13,pcVar22,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          pfStack_a38 = (fdb_kvs_handle *)0x11bce4;
          fVar2 = fdb_commit(pfStack_a18,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        uVar12 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
      } while (uVar12 != 0x2711);
      pfStack_a38 = (fdb_kvs_handle *)0x11bd0a;
      pthread_join(pStack_a10,(void **)(auStack_a07 + 0xf));
      pfStack_a38 = (fdb_kvs_handle *)0x11bd2d;
      fVar2 = fdb_set_kv(pfStack_a20,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      pfStack_a38 = (fdb_kvs_handle *)0x11bd44;
      fVar2 = fdb_commit(pfStack_a18,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      pfStack_a38 = (fdb_kvs_handle *)0x11bd5e;
      fdb_get_kvs_info(pfStack_a20,(fdb_kvs_info *)auStack_9c8);
      fconfig_01 = (fdb_config *)auStack_9c8._8_8_;
      pfStack_a38 = (fdb_kvs_handle *)0x11bd85;
      fVar2 = fdb_set_kv(pfStack_a20,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      pfStack_a38 = (fdb_kvs_handle *)0x11bdb0;
      fVar2 = fdb_set_kv(pfStack_a20,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      pfStack_a38 = (fdb_kvs_handle *)0x11bdc7;
      fVar2 = fdb_commit(pfStack_a18,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      pfStack_a38 = (fdb_kvs_handle *)0x11bddc;
      fVar2 = fdb_rollback(&pfStack_a20,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_a38 = (fdb_kvs_handle *)0x11bdf6;
        fdb_get_kvs_info(pfStack_a20,(fdb_kvs_info *)auStack_9c8);
        if ((fdb_config *)auStack_9c8._8_8_ != fconfig_01) {
          pfStack_a38 = (fdb_kvs_handle *)0x11be07;
          rollback_during_ops_test();
        }
        pfStack_a38 = (fdb_kvs_handle *)0x11be11;
        fdb_close(pfStack_a18);
        pfStack_a38 = (fdb_kvs_handle *)0x11be16;
        fdb_shutdown();
        pfStack_a38 = (fdb_kvs_handle *)0x11be1b;
        memleak_end();
        pcVar22 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        pfStack_a38 = (fdb_kvs_handle *)0x11be4c;
        fprintf(_stderr,pcVar22,"rollback during ops test");
        return;
      }
    }
    else {
      pfStack_a38 = (fdb_kvs_handle *)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_9c8;
      pfStack_a38 = (fdb_kvs_handle *)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      pfStack_a38 = (fdb_kvs_handle *)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      pfStack_a38 = (fdb_kvs_handle *)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      pfStack_a38 = (fdb_kvs_handle *)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      pfStack_a38 = (fdb_kvs_handle *)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      pfStack_a38 = (fdb_kvs_handle *)0x11bfbb;
      rollback_during_ops_test();
    }
    pfStack_a38 = (fdb_kvs_handle *)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    pfStack_a38 = (fdb_kvs_handle *)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_01 = (fdb_config *)auStack_9c8;
    pfStack_a38 = (fdb_kvs_handle *)0x11be7c;
    fdb_get_default_config();
    pcVar22 = (char *)&fStack_8d0;
    pfStack_a38 = (fdb_kvs_handle *)0x11be94;
    memcpy(pcVar22,fconfig_01,0xf8);
    fStack_8d0.block_reusing_threshold = 0;
    pfStack_a38 = (fdb_kvs_handle *)0x11beb3;
    fVar2 = fdb_open(&pfStack_a18,"mvcc_test1",(fdb_config *)pcVar22);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_01 = (fdb_config *)auStack_9c8;
    pfStack_a38 = (fdb_kvs_handle *)0x11bec8;
    fdb_get_default_kvs_config();
    auStack_a07._39_8_ = uStack_9b8;
    auStack_a07._23_8_ = auStack_9c8._0_8_;
    auStack_a07._31_8_ = auStack_9c8._8_8_;
    pfStack_a38 = (fdb_kvs_handle *)0x11beeb;
    fVar2 = fdb_kvs_open_default(pfStack_a18,&pfStack_a20,(fdb_kvs_config *)(auStack_a07 + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_a24 = (int)__tv->tv_sec;
      if (1 < (long)iStack_a24) {
        unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x156958;
        pcVar22 = auStack_a07;
        unaff_R12 = (fdb_kvs_handle *)0x1565bd;
        __tv = (timeval *)(long)iStack_a24;
        do {
          pfStack_a38 = (fdb_kvs_handle *)0x11bf2c;
          sprintf(pcVar22,"%d",(ulong)__tv & 0xffffffff);
          pfVar15 = pfStack_a20;
          pfStack_a38 = (fdb_kvs_handle *)0x11bf39;
          sVar5 = strlen(pcVar22);
          pfStack_a38 = (fdb_kvs_handle *)0x11bf50;
          fVar2 = fdb_set_kv(pfVar15,pcVar22,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            pfStack_a38 = (fdb_kvs_handle *)0x11bf76;
            fVar2 = fdb_rollback(&pfStack_a20,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      pfStack_a38 = (fdb_kvs_handle *)0x11bf91;
      fdb_close(pfStack_a18);
      pfStack_a38 = (fdb_kvs_handle *)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_a38 = (fdb_kvs_handle *)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  pfStack_a38 = (fdb_kvs_handle *)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  pfStack_a38 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_bf0 = (fdb_kvs_handle *)0x11bff0;
  ptStack_a58 = __tv;
  pfStack_a50 = unaff_R12;
  pfStack_a48 = unaff_R13;
  pfStack_a40 = fconfig_01;
  pfStack_a38 = (fdb_kvs_handle *)pcVar22;
  gettimeofday((timeval *)(auStack_bb7 + 0xf),(__timezone_ptr_t)0x0);
  pfStack_bf0 = (fdb_kvs_handle *)0x11bff5;
  memleak_start();
  pfStack_bf0 = (fdb_kvs_handle *)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_b50;
  pfStack_bf0 = (fdb_kvs_handle *)0x11c011;
  fdb_get_default_config();
  pfStack_bf0 = (fdb_kvs_handle *)0x11c025;
  fVar2 = fdb_open(&pfStack_bd8,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_b98 + 0x30);
    pfStack_bf0 = (fdb_kvs_handle *)0x11c03d;
    fdb_get_default_kvs_config();
    pfStack_bf0 = (fdb_kvs_handle *)0x11c04f;
    fVar2 = fdb_kvs_open_default(pfStack_bd8,&pfStack_be0,(fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x156958;
    pcVar22 = auStack_bb7;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c07e;
      sprintf(pcVar22,"%d",fconfig_00);
      unaff_R13 = pfStack_be0;
      pfStack_bf0 = (fdb_kvs_handle *)0x11c08b;
      sVar5 = strlen(pcVar22);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c0a2;
      fVar2 = fdb_set_kv(unaff_R13,pcVar22,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_bf0 = (fdb_kvs_handle *)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar12 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar12;
    } while (uVar12 != 4);
    pfStack_bf0 = (fdb_kvs_handle *)0x11c0bd;
    fdb_commit(pfStack_bd8,'\0');
    pfStack_bf0 = (fdb_kvs_handle *)0x11c0e0;
    fVar2 = fdb_set_kv(pfStack_be0,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c10b;
    fVar2 = fdb_set_kv(pfStack_be0,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c122;
    fVar2 = fdb_commit(pfStack_bd8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c139;
    fVar2 = fdb_rollback(&pfStack_be0,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_00 = (fdb_config *)auStack_b98;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c153;
    fdb_get_kvs_info(pfStack_be0,(fdb_kvs_info *)fconfig_00);
    if (auStack_b98._8_8_ != 3) {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    pfStack_bf0 = (fdb_kvs_handle *)0x11c17a;
    fVar2 = fdb_snapshot_open(pfStack_be0,&pfStack_bc0,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c1a2;
    fdb_iterator_init(pfStack_bc0,&pfStack_bd0,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_bc8;
    pfStack_bc8 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_bd0,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      pfStack_bf0 = (fdb_kvs_handle *)0x11c1d3;
      fdb_doc_free(pfStack_bc8);
      pfStack_bc8 = (fdb_doc *)0x0;
      pfStack_bf0 = (fdb_kvs_handle *)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_bd0);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c201;
      fdb_iterator_close(pfStack_bd0);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c20b;
      fdb_kvs_close(pfStack_bc0);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c215;
      fdb_close(pfStack_bd8);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c21a;
      fdb_shutdown();
      pfStack_bf0 = (fdb_kvs_handle *)0x11c21f;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pfStack_bf0 = (fdb_kvs_handle *)0x11c250;
      fprintf(_stderr,pcVar22,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  pfStack_bf0 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_30a8 = (code *)0x11c2b0;
  pfStack_c18 = fconfig_00;
  pfStack_c10 = unaff_R12;
  pfStack_c08 = unaff_R13;
  pfStack_c00 = fconfig_01;
  pfStack_bf8 = (fdb_kvs_handle *)pcVar22;
  pfStack_bf0 = pfVar15;
  gettimeofday(&tStack_3030,(__timezone_ptr_t)0x0);
  pcStack_30a8 = (code *)0x11c2b5;
  memleak_start();
  pcStack_30a8 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_30a8 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_30a8 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_2f18.wal_threshold = 0x400;
  fStack_2f18.compaction_mode = 0;
  fStack_2f18.durability_opt = 2;
  pfVar13 = (fdb_kvs_handle *)(apfStack_2d20 + 0x20);
  ppfVar10 = apfStack_3020;
  pcVar22 = "kvs%d";
  uVar18 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_30a8 = (code *)0x11c31b;
    sprintf((char *)ppfVar10,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar20 = (char *)(apfStack_3090 + (long)__s);
    pcStack_30a8 = (code *)0x11c336;
    ppfVar17 = (fdb_kvs_handle **)pcVar20;
    fVar2 = fdb_open((fdb_file_handle **)pcVar20,(char *)ppfVar10,
                     (fdb_config *)(apfStack_3020 + 0x21));
    iVar3 = (int)ppfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar17 = (fdb_kvs_handle **)0x0;
    ppfStack_30a0 = __s;
    pfStack_3098 = pfVar13;
    do {
      __s = ppfVar17;
      pcStack_30a8 = (code *)0x11c35b;
      sprintf((char *)ppfVar10,"kvs%d",(ulong)(uint)((int)__s + (int)uVar18));
      pfVar23 = *(fdb_kvs_handle **)pcVar20;
      pcStack_30a8 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar23,(fdb_kvs_handle **)pfVar13,(char *)ppfVar10,
                           (fdb_kvs_config *)(apfStack_3090 + 9));
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_30a8 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).custom_cmp;
      ppfVar17 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_30a0 + 1);
    uVar18 = uVar18 + 0x80;
    pfVar13 = (fdb_kvs_handle *)&pfStack_3098[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_3020 + 0x40;
  ppfVar10 = apfStack_2d20;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    uVar18 = 0;
    do {
      pcStack_30a8 = (code *)0x11c3cf;
      sprintf((char *)__s,"key%08d",uVar18);
      pcStack_30a8 = (code *)0x11c3e2;
      sprintf((char *)ppfVar10,"value%08d",uVar18);
      pcVar22 = (char *)apfStack_2d20[(long)&pfVar13->op_stats];
      pcStack_30a8 = (code *)0x11c3f2;
      sVar5 = strlen((char *)__s);
      pcVar20 = (char *)(sVar5 + 1);
      pcStack_30a8 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar10);
      pcStack_30a8 = (code *)0x11c413;
      pfVar23 = (fdb_kvs_handle *)pcVar22;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar22,__s,(size_t)pcVar20,ppfVar10,sVar5 + 1);
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar12 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
  } while (pfVar13 != (fdb_kvs_handle *)0x400);
  pcVar20 = (char *)0x0;
  do {
    pfVar23 = apfStack_3090[(long)pcVar20];
    if (((ulong)pcVar20 & 1) == 0) {
      pcStack_30a8 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\0');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_30a8 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\x01');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while (pcVar20 != (char *)0x8);
  pcVar20 = "key%08d";
  __s = apfStack_3020 + 0x40;
  ppfVar10 = (fdb_kvs_handle **)0x0;
  do {
    uVar18 = 0;
    do {
      pcStack_30a8 = (code *)0x11c488;
      sprintf((char *)__s,"key%08d",uVar18);
      pfVar13 = apfStack_2d20[(long)(ppfVar10 + 4)];
      pcStack_30a8 = (code *)0x11c498;
      sVar5 = strlen((char *)__s);
      pcStack_30a8 = (code *)0x11c4a7;
      pfVar23 = pfVar13;
      fVar2 = fdb_del_kv(pfVar13,__s,sVar5 + 1);
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar12 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar12;
    } while (uVar12 != 10);
    ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
  } while (ppfVar10 != (fdb_kvs_handle **)0x400);
  pcVar20 = (char *)0x0;
  do {
    pfVar23 = apfStack_3090[(long)pcVar20];
    if (((ulong)pcVar20 & 1) == 0) {
      pcStack_30a8 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\0');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_30a8 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\x01');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while (pcVar20 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar20 = (char *)(apfStack_2d20 + 0x20);
  do {
    pcStack_30a8 = (code *)0x11c515;
    ppfVar17 = (fdb_kvs_handle **)pcVar20;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar20,10);
    iVar3 = (int)ppfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    __s = __s + 8;
    pcVar20 = (char *)((long)pcVar20 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar10 = apfStack_3090;
  pcVar20 = "kvs%d";
  __s = apfStack_3020;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfVar23 = apfStack_2d20[(long)&pfVar13->op_stats];
    pcStack_30a8 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar23);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_30a8 = (code *)0x11c56d;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar13 & 0xffffffff);
    pfVar23 = *ppfVar10;
    pcStack_30a8 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar23,(char *)__s);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->config).wal_threshold;
    ppfVar10 = ppfVar10 + 1;
  } while (pfVar13 != (fdb_kvs_handle *)0x400);
  pcVar20 = (char *)0x0;
  do {
    pfVar23 = apfStack_3090[(long)pcVar20];
    if (((ulong)pcVar20 & 1) == 0) {
      pcStack_30a8 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\0');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_30a8 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar23,'\x01');
      iVar3 = (int)pfVar23;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while (pcVar20 != (char *)0x8);
  pcVar20 = "mvcc_test_compact%d";
  __s = apfStack_3020;
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_30a8 = (code *)0x11c5eb;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar13 & 0xffffffff);
    pfVar23 = apfStack_3090[(long)pfVar13];
    pcStack_30a8 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar23,(char *)__s);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
  } while (pfVar13 != (fdb_kvs_handle *)0x8);
  pcVar20 = (char *)0x0;
  pcStack_30a8 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar23 = apfStack_3090[(long)pcVar20];
    pcStack_30a8 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar23);
    iVar3 = (int)pfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar20 = (char *)((long)pcVar20 + 1);
    if (pcVar20 == (char *)0x8) {
      pcStack_30a8 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_30a8 = (code *)0x11c633;
      memleak_end();
      pcVar22 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_30a8 = (code *)0x11c664;
      fprintf(_stderr,pcVar22,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_30a8 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_30a8 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_30a8 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_30a8 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_30a8 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_30a8 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_30a8 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_35b0 = (code *)0x11c6e3;
  ppfStack_30d0 = (fdb_kvs_handle **)pcVar20;
  ppfStack_30c8 = ppfVar10;
  pfStack_30c0 = (fdb_kvs_handle *)pcVar22;
  ppfStack_30b8 = __s;
  pfStack_30b0 = pfVar13;
  pcStack_30a8 = (code *)uVar18;
  gettimeofday(&tStack_3528,(__timezone_ptr_t)0x0);
  pcStack_35b0 = (code *)0x11c6e8;
  memleak_start();
  pcStack_35b0 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_35b0 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_31c8.flags = 1;
  fStack_31c8.block_reusing_threshold = 0;
  fStack_31c8.seqtree_opt = 0;
  pcStack_35b0 = (code *)0x11c728;
  fStack_31c8.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_35b0 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_3598,"./mvcc_test1",(fdb_config *)(acStack_32c8 + 0x100));
  iStack_3574 = iVar3;
  if (iVar3 == 0) {
    pcStack_35b0 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_3598,apfStack_3568,&fStack_3548);
    pcVar22 = (char *)0x1;
  }
  else {
    ppfVar10 = apfStack_3568;
    uVar18 = 0;
    do {
      pcStack_35b0 = (code *)0x11c76d;
      sprintf(acStack_3530,"kv%d",uVar18 & 0xffffffff);
      pcStack_35b0 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_3598,ppfVar10,acStack_3530,&fStack_3548);
      uVar18 = uVar18 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar18 != 3);
    pcVar22 = (char *)0x3;
  }
  uStack_359c = 0;
  do {
    uVar18 = 0;
    do {
      pcStack_35b0 = (code *)0x11c7d4;
      sprintf(acStack_33c8,"key%d",uVar18 & 0xffffffff);
      pcStack_35b0 = (code *)0x11c7f5;
      sprintf(acStack_3518,"meta-%d-%d",(ulong)uStack_359c,uVar18 & 0xffffffff);
      pcStack_35b0 = (code *)0x11c814;
      sprintf(acStack_32c8,"body-%d-%d",(ulong)uStack_359c,uVar18 & 0xffffffff);
      doc = (btree *)(&bStack_3418.ksize + uVar18 * 8);
      pcStack_35b0 = (code *)0x11c827;
      sVar5 = strlen(acStack_33c8);
      pcStack_35b0 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_3518);
      pcStack_35b0 = (code *)0x11c842;
      sVar6 = strlen(acStack_32c8);
      pcStack_35b0 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_33c8,sVar5,acStack_3518,metalen._M_i,acStack_32c8,sVar6
                    );
      pfVar13 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_35b0 = (code *)0x11c878;
        fdb_set(apfStack_3568[(long)pfVar13],*(fdb_doc **)doc);
        pfVar13 = (fdb_kvs_handle *)((long)pfVar13 + 1);
      } while ((fdb_kvs_handle *)pcVar22 != pfVar13);
      pcStack_35b0 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_3418.ksize + uVar18 * 8));
      uVar18 = uVar18 + 1;
    } while (uVar18 != 10);
    pcStack_35b0 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_3598,~(byte)uStack_359c & 1);
    uStack_359c = uStack_359c + 1;
    pcVar20 = (char *)(ulong)uStack_359c;
  } while (uStack_359c != 5);
  pcStack_35b0 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_3598,&pfStack_3580,&uStack_3550);
  pfVar23 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_35b0 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_3568,(pfStack_3580[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_3590 = (fdb_kvs_handle *)0x0;
    pcVar20 = acStack_32c8;
    pfVar23 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_35b0 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_3568[(long)pfVar23],&pfStack_3570,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_35b0 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_35b0 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_35b0 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_35b0 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_35b0 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_3570,&pfStack_3588,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_35b0 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_35b0 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_3588,(fdb_doc **)&pfStack_3590);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_35b0 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_35b0 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_35b0 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_35b0 = (code *)0x11c98b;
        sprintf(acStack_33c8,"key%d",metalen._M_i);
        if (pfVar23 == (fdb_kvs_handle *)0x0) {
          pcStack_35b0 = (code *)0x11c9da;
          sprintf(acStack_3518,"meta-1-%d",metalen._M_i);
          pcStack_35b0 = (code *)0x11c9ee;
          sprintf(pcVar20,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_35b0 = (code *)0x11c9ae;
          sprintf(acStack_3518,"meta-%d-%d",4,metalen._M_i);
          pcStack_35b0 = (code *)0x11c9c7;
          sprintf(pcVar20,"body-%d-%d",4);
        }
        pfVar13 = pfStack_3590;
        doc = (btree *)pfStack_3590->op_stats;
        pcStack_35b0 = (code *)0x11ca0a;
        iVar3 = bcmp(doc,acStack_33c8,*(size_t *)&pfStack_3590->kvs_config);
        if (iVar3 != 0) {
          pcStack_35b0 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar13->staletree;
        pcStack_35b0 = (code *)0x11ca2a;
        iVar3 = bcmp(doc,acStack_3518,(size_t)(pfVar13->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cba4;
        doc = (pfVar13->field_6).seqtree;
        pcStack_35b0 = (code *)0x11ca45;
        iVar3 = bcmp(doc,pcVar20,(size_t)(pfVar13->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011cb94;
        pcStack_35b0 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar13);
        pfStack_3590 = (fdb_kvs_handle *)0x0;
        uVar12 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar12;
        pcStack_35b0 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_3588);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar12 != 10) goto LAB_0011cbbe;
      pcStack_35b0 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_3588);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_35b0 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_3570);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar23 = (fdb_kvs_handle *)&(pfVar23->kvs_config).field_0x1;
    } while (pfVar23 != (fdb_kvs_handle *)pcVar22);
    pcVar20 = (char *)0x0;
    do {
      pcStack_35b0 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_3568[(long)pcVar20]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar20 = pcVar20 + 1;
    } while (pcVar22 != pcVar20);
    pcStack_35b0 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_3598,pfStack_3580[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_35b0 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_3580,uStack_3550);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_35b0 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_3598);
      pcStack_35b0 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_35b0 = (code *)0x11cb10;
      memleak_end();
      pcVar22 = "single kv mode:";
      if ((char)iStack_3574 != '\0') {
        pcVar22 = "multiple kv mode:";
      }
      pcStack_35b0 = (code *)0x11cb40;
      sprintf(acStack_32c8,"rollback without seqtree in %s",pcVar22);
      pcVar22 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar22 = "%s FAILED\n";
      }
      pcStack_35b0 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar22,acStack_32c8);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_35b0 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_35b0 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_35b0 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_35b0 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_3788 = (fdb_kvs_handle *)0x11cc03;
  pcStack_35d8 = pcVar20;
  aStack_35d0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_35c8 = doc;
  pfStack_35c0 = pfVar13;
  pfStack_35b8 = pfVar23;
  pcStack_35b0 = (code *)pcVar22;
  gettimeofday(&tStack_3728,(__timezone_ptr_t)0x0);
  pfStack_3788 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_3788 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar22 = auStack_3718 + 0x48;
  pfStack_3788 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_3788 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_3780,"./mvcc_test2",(fdb_config *)pcVar22);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar22 = auStack_3718;
    pfStack_3788 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_3730 = (btreeblk_handle *)auStack_3718._16_8_;
    pfStack_3740 = (filemgr *)auStack_3718._0_8_;
    pdStack_3738 = (docio_handle *)auStack_3718._8_8_;
    pfStack_3788 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_3780,&pfStack_3778,(fdb_kvs_config *)&pfStack_3740);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_3788 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_3780,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar22 = "key%d";
    pfVar13 = (fdb_kvs_handle *)acStack_376f;
    pfVar23 = (fdb_kvs_handle *)0x1565bd;
    uVar18 = 0;
    do {
      pfStack_3788 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar13,"key%d",uVar18);
      pfVar16 = pfStack_3778;
      pfStack_3788 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar13);
      pfStack_3788 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(pfVar16,pfVar13,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_3788 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar12 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar12;
    } while (uVar12 != 10);
    pfStack_3788 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_3780,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_3788 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_3780,"./mvcc_test3");
    pfStack_3788 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_3780,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar22 = "key%d";
    pfVar13 = (fdb_kvs_handle *)acStack_376f;
    uVar12 = 0;
    do {
      pfStack_3788 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar13,"key%d",(ulong)uVar12);
      pfVar23 = pfStack_3778;
      pfStack_3788 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar13);
      pfStack_3788 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar23,pfVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 10);
    pfStack_3788 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_3780,(fdb_file_info *)auStack_3718);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar22 = (char *)((ulong)auStack_3718._40_8_ / (ulong)uStack_36cc);
    pfStack_3788 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_3780);
    pfStack_3788 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_3788 = (fdb_kvs_handle *)0x11cdbe;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_36cc * (long)pcVar22,
                       (ulong)((uStack_36cc >> 2) + uStack_36cc * 2));
    if (iVar3 < 0) goto LAB_0011cf90;
    pfStack_3788 = (fdb_kvs_handle *)0x11cde8;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar22 * 4 + 8) * (ulong)uStack_36cc,
                       (ulong)(uStack_36cc >> 2));
    if (iVar3 < 0) goto LAB_0011cf95;
    pfStack_3788 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_3780,"./mvcc_test3",(fdb_config *)(auStack_3718 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar22 = (char *)&pfStack_3760;
    pfStack_3788 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_3730 = pbStack_3750;
    pfStack_3740 = pfStack_3760;
    pdStack_3738 = pdStack_3758;
    pfStack_3788 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_3780,&pfStack_3778,(fdb_kvs_config *)&pfStack_3740);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_3788 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_3780,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar12 = 0;
      do {
        pfStack_3788 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_376f,"key%d",(ulong)uVar12);
        pfVar23 = pfStack_3778;
        pfStack_3788 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_376f);
        pfStack_3788 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar23,acStack_376f,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 10);
      pfStack_3788 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_3780);
      pfVar23 = (fdb_kvs_handle *)&pfStack_3760;
      uVar12 = 0;
      while( true ) {
        pfStack_3788 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_376f,"key%d",(ulong)uVar12);
        pfVar13 = pfStack_3778;
        pfStack_3788 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_376f);
        pfStack_3788 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar13,acStack_376f,sVar5,(void **)pfVar23,&sStack_3748);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_3788 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_3760);
        uVar12 = uVar12 + 1;
        if (uVar12 == 10) {
          pfStack_3788 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_3780);
          pfStack_3788 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_3788 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar22 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar22 = "%s FAILED\n";
          }
          pfStack_3788 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar22,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar13 = (fdb_kvs_handle *)acStack_376f;
      pcVar22 = "key%d";
      pfStack_3788 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_3788 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_3788 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_3788 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_3798 = (fdb_config *)pcVar22;
  pfStack_3790 = pfVar13;
  pfStack_3788 = pfVar23;
  gettimeofday(&tStack_38b8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_38c8 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_38d8,"./mvcc_test1",&fStack_3890);
  fdb_kvs_open_default(pfStack_38d8,&pfStack_38c0,&fStack_38a8);
  fdb_kvs_open(pfStack_38d8,&pfStack_38e0,"kv",&fStack_38a8);
  fVar2 = fdb_set_kv(pfStack_38e0,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_38e0,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_38d8,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_38e0,&pfStack_38e8,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_38e8,&pfStack_38d0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_38e8);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_38e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_38d8,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_38d0,&pfStack_38c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_38c8);
    fVar2 = fdb_iterator_close(pfStack_38d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_38e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_38c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_38d8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar22 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar22 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar22,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_all_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t rollback_seq;
    uint64_t num_markers;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous dummy files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test6", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_all_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (multi_kv) {
        TEST_CHK(num_markers == 8);
    } else {
        TEST_CHK(num_markers == 4);
    }

    // rollback to 15
    i = 1;
    rollback_seq = (fdb_seqnum_t)(n - (i*5));
    status = fdb_rollback_all(dbfile, markers[i].marker);
    if (multi_kv) {
        // In multi-kv mode, we cannot rollback all instances,
        // without closing them first, since a rollback point
        // may end up invalidating open handles
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);

        for (r = 0; r < num_kvs; ++r) {
            fdb_kvs_close(db[r]);
        }

        fdb_file_handle *fhandle;
        fdb_kvs_handle *dbhandle;
        status = fdb_open(&fhandle, "./mvcc_test6", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(fhandle, &dbhandle, "kv0", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Rollback again, but should fail again because there is a new handle created
        status = fdb_rollback_all(dbfile, markers[i].marker);
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);
        // Close the handle to have the rollback pass
        status = fdb_kvs_close(dbhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(fhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_rollback_all(dbfile, markers[i].marker);
    }

    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                    (void *) "rollback_all_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = 0; r < num_kvs; ++r) {
        char *body;
        size_t bodylen;
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == rollback_seq);
        TEST_CHK(info.doc_count == rollback_seq);
        status = fdb_get(db[r], doc[n - 1]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_get_kv(db[r], doc[0]->key, doc[0]->keylen,
                            (void **)&body, &bodylen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(doc[0]->body, body, bodylen);
        free(body);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback all test %s", multi_kv ? "multiple kv mode:"
                                                      : "single kv mode:");
    TEST_RESULT(bodybuf);
}